

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint128 CityHash128(char *s,size_t len)

{
  uint64 uVar1;
  ulong in_RSI;
  size_t in_stack_00000048;
  char *in_stack_00000050;
  uint128 in_stack_00000058;
  pair<unsigned_long,_unsigned_long> local_70;
  ulong local_60;
  ulong local_58;
  pair<unsigned_long,_unsigned_long> local_50;
  uint64 local_40;
  ulong local_38;
  pair<unsigned_long,_unsigned_long> local_30;
  ulong local_20;
  uint128 local_10;
  
  if (in_RSI < 0x10) {
    if (in_RSI < 8) {
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
                (&local_70,&k0,&k1);
      local_10 = CityHash128WithSeed(in_stack_00000050,in_stack_00000048,in_stack_00000058);
    }
    else {
      local_20 = in_RSI;
      uVar1 = Fetch64((char *)0x2541ef);
      local_58 = uVar1 ^ local_20 * -0x3c5a37a36834ced9;
      uVar1 = Fetch64((char *)0x25421d);
      local_60 = uVar1 ^ 0xb492b66fbe98f273;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
                (&local_50,&local_58,&local_60);
      local_10 = CityHash128WithSeed(in_stack_00000050,in_stack_00000048,in_stack_00000058);
    }
  }
  else {
    uVar1 = Fetch64((char *)0x25416c);
    local_38 = uVar1 ^ 0xc949d7c7509e6557;
    local_40 = Fetch64((char *)0x25418f);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_30,&local_38,&local_40);
    local_10 = CityHash128WithSeed(in_stack_00000050,in_stack_00000048,in_stack_00000058);
  }
  return local_10;
}

Assistant:

uint128 CityHash128(const char *s, size_t len) {
  if (len >= 16) {
    return CityHash128WithSeed(s + 16,
                               len - 16,
                               uint128(Fetch64(s) ^ k3,
                                       Fetch64(s + 8)));
  } else if (len >= 8) {
    return CityHash128WithSeed(NULL,
                               0,
                               uint128(Fetch64(s) ^ (len * k0),
                                       Fetch64(s + len - 8) ^ k1));
  } else {
    return CityHash128WithSeed(s, len, uint128(k0, k1));
  }
}